

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O0

void save(void)

{
  value_type vVar1;
  FILE *__stream;
  reference pvVar2;
  uint *puVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference this;
  int local_20;
  int local_1c;
  int k;
  int j;
  int i_1;
  int i;
  FILE *f;
  
  __stream = fopen("learned.txt","w");
  for (j = 0; j < num_c; j = j + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&w0,(long)j);
    fprintf(__stream,"%f",*pvVar2);
    if (j == num_c + -1) {
      fprintf(__stream,"\n");
    }
    else {
      fprintf(__stream,",");
    }
  }
  for (k = 0; k < num_c; k = k + 1) {
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&shapelet_n,(long)k);
    fprintf(__stream,"%d\n",(ulong)*puVar3);
    local_1c = 0;
    while( true ) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&shapelet_n,(long)k);
      if (*pvVar4 <= local_1c) break;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&w,(long)k);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1c);
      vVar1 = *pvVar2;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&shapelet_length,(long)k);
      puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_1c);
      fprintf(__stream,"%f,%d",vVar1,(ulong)*puVar3);
      local_20 = 0;
      while( true ) {
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&shapelet_length,(long)k);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_1c);
        if (*pvVar4 <= local_20) break;
        this = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&shapelet,(long)k);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](this,(long)local_1c);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_20);
        fprintf(__stream,",%f",*pvVar2);
        local_20 = local_20 + 1;
      }
      fprintf(__stream,"\n");
      local_1c = local_1c + 1;
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void save() {
    FILE *f;
    f = fopen("learned.txt", "w");

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%f", w0[i]);
        if (i != num_c - 1) {
            fprintf(f, ",");
        } else {
            fprintf(f, "\n");
        }
    }

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%d\n", shapelet_n[i]);
        for (int j = 0; j < shapelet_n[i]; ++j) {
            fprintf(f, "%f,%d", w[i][j], shapelet_length[i][j]);
            for (int k = 0; k < shapelet_length[i][j]; ++k) {
                fprintf(f, ",%f", shapelet[i][j][k]);
            }
            fprintf(f, "\n");
        }
    }

    fclose(f);
}